

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O1

void cali::init_attribute_classes(Caliper *c)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"class.aggregatable","");
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_50,7,0x40,0,0,0);
  class_aggregatable_attr = CONCAT44(extraout_var,iVar1);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"class.symboladdress","");
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_50,7,0x40,0,0,0);
  class_symboladdress_attr = CONCAT44(extraout_var_00,iVar1);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"class.memoryaddress","");
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_50,7,0x40,0,0,0);
  class_memoryaddress_attr = CONCAT44(extraout_var_01,iVar1);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"class.iteration","");
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_50,7,0x40,0,0,0);
  class_iteration_attr = CONCAT44(extraout_var_02,iVar1);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"subscription_event","");
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_50,7,0x40,0,0,0);
  subscription_event_attr = CONCAT44(extraout_var_03,iVar1);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  cali_class_symboladdress_attr_id = 0xffffffffffffffff;
  cali_class_aggregatable_attr_id = 0xffffffffffffffff;
  if (class_aggregatable_attr != 0) {
    cali_class_aggregatable_attr_id = *(cali_id_t *)(class_aggregatable_attr + 0x10);
  }
  if (class_symboladdress_attr != 0) {
    cali_class_symboladdress_attr_id = *(cali_id_t *)(class_symboladdress_attr + 0x10);
  }
  cali_class_iteration_attr_id = 0xffffffffffffffff;
  cali_class_memoryaddress_attr_id = 0xffffffffffffffff;
  if (class_memoryaddress_attr != 0) {
    cali_class_memoryaddress_attr_id = *(cali_id_t *)(class_memoryaddress_attr + 0x10);
  }
  if (class_iteration_attr != 0) {
    cali_class_iteration_attr_id = *(cali_id_t *)(class_iteration_attr + 0x10);
  }
  return;
}

Assistant:

void init_attribute_classes(Caliper* c)
{
    class_aggregatable_attr  = c->create_attribute("class.aggregatable", CALI_TYPE_BOOL, CALI_ATTR_SKIP_EVENTS);
    class_symboladdress_attr = c->create_attribute("class.symboladdress", CALI_TYPE_BOOL, CALI_ATTR_SKIP_EVENTS);
    class_memoryaddress_attr = c->create_attribute("class.memoryaddress", CALI_TYPE_BOOL, CALI_ATTR_SKIP_EVENTS);
    class_iteration_attr     = c->create_attribute("class.iteration", CALI_TYPE_BOOL, CALI_ATTR_SKIP_EVENTS);
    subscription_event_attr  = c->create_attribute("subscription_event", CALI_TYPE_BOOL, CALI_ATTR_SKIP_EVENTS);

    cali_class_aggregatable_attr_id  = class_aggregatable_attr.id();
    cali_class_symboladdress_attr_id = class_symboladdress_attr.id();
    cali_class_memoryaddress_attr_id = class_memoryaddress_attr.id();
    cali_class_iteration_attr_id     = class_iteration_attr.id();
}